

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_protocol.cc
# Opt level: O1

session * __thiscall helix::nasdaq::itch50_protocol::new_session(itch50_protocol *this,void *data)

{
  int iVar1;
  session *psVar2;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)&this->_name);
  if (iVar1 == 0) {
    psVar2 = (session *)operator_new(0xd0);
    psVar2->_data = data;
    psVar2->_vptr_session = (_func_int **)&PTR__binaryfile_session_00122ad8;
    itch50_handler::itch50_handler((itch50_handler *)(psVar2 + 1));
    return psVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"unknown protocol: ",&this->_name);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

session* itch50_protocol::new_session(void *data)
{
    if (_name == "nasdaq-binaryfile-itch50") {
        return new binaryfile_session<itch50_handler>(data);
    } else {
        throw std::invalid_argument("unknown protocol: " + _name);
    }
}